

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataI2c.cpp
# Opt level: O3

size_t __thiscall remote_wiring::FirmataI2c::_available(FirmataI2c *this)

{
  _Elt_pointer puVar1;
  _Map_pointer ppuVar2;
  _Map_pointer ppuVar3;
  _Elt_pointer puVar4;
  _Elt_pointer puVar5;
  _Elt_pointer puVar6;
  int iVar7;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->_rx_mutex);
  if (iVar7 == 0) {
    puVar1 = (this->_rx).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    ppuVar2 = (this->_rx).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    ppuVar3 = (this->_rx).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    puVar4 = (this->_rx).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first;
    puVar5 = (this->_rx).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    puVar6 = (this->_rx).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_rx_mutex);
    return (size_t)(puVar5 + (long)(puVar1 + ((((((ulong)((long)ppuVar2 - (long)ppuVar3) >> 3) - 1)
                                               + (ulong)(ppuVar2 == (_Map_pointer)0x0)) * 0x200 -
                                              (long)puVar4) - (long)puVar6)));
  }
  std::__throw_system_error(iVar7);
}

Assistant:

size_t
FirmataI2c::_available (
    void
) {
    std::lock_guard<std::mutex> lock(_rx_mutex);
    return _rx.size();
}